

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

void __thiscall Socket::Socket(Socket *this)

{
  SocketError *this_00;
  int iVar1;
  string local_40;
  
  iVar1 = socket(2,1,0);
  this->socketDescriptor = iVar1;
  if (iVar1 != 0) {
    return;
  }
  this_00 = (SocketError *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Socket error: could not create socket!","");
  SocketError::SocketError(this_00,&local_40,0);
  __cxa_throw(this_00,&SocketError::typeinfo,SocketError::~SocketError);
}

Assistant:

Socket::Socket()
{
    socketDescriptor = socket(AF_INET, SOCK_STREAM, 0);
    if(socketDescriptor == 0)
    {
        throw SocketError("Socket error: could not create socket!");
    }
}